

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O2

tnt_iter * tnt_iter_map(tnt_iter *i,char *data,size_t size)

{
  int iVar1;
  uint32_t uVar2;
  tnt_iter *ptVar3;
  char *local_28;
  char *tmp_data;
  
  local_28 = data;
  iVar1 = mp_check(&local_28,data + size);
  if ((((iVar1 == 0) && (size != 0 && data != (char *)0x0)) && (mp_type_hint[(byte)*data] == MP_MAP)
      ) && (ptVar3 = tnt_iter_init(i), ptVar3 != (tnt_iter *)0x0)) {
    ptVar3->type = TNT_ITER_MAP;
    ptVar3->next = tnt_iter_map_next;
    ptVar3->rewind = tnt_iter_map_rewind;
    ptVar3->free = (_func_void_tnt_iter_ptr *)0x0;
    (ptVar3->data).array.data = data;
    (ptVar3->data).array.first_elem = data;
    uVar2 = mp_decode_map(&(ptVar3->data).array.first_elem);
    (ptVar3->data).map.pair_count = uVar2;
    (ptVar3->data).map.cur_index = -1;
    return ptVar3;
  }
  return (tnt_iter *)0x0;
}

Assistant:

struct tnt_iter *
tnt_iter_map(struct tnt_iter *i, const char *data, size_t size)
{
	const char *tmp_data = data;
	if (mp_check(&tmp_data, data + size) != 0)
		return NULL;
	if (!data || !size || mp_typeof(*data) != MP_MAP)
		return NULL;
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_MAP;
	i->next = tnt_iter_map_next;
	i->rewind = tnt_iter_map_rewind;
	i->free = NULL;
	struct tnt_iter_map *itr = TNT_IMAP(i);
	itr->data = data;
	itr->first_key = data;
	itr->pair_count = mp_decode_map(&itr->first_key);
	itr->cur_index = -1;
	return i;
}